

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O3

shared_ptr<const_mathiu::impl::Expr> __thiscall
mathiu::impl::insertProduct<mathiu::impl::Product,std::shared_ptr<mathiu::impl::Expr_const>>
          (impl *this,Product *c,shared_ptr<const_mathiu::impl::Expr> *t)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<const_mathiu::impl::Expr> sVar2;
  initializer_list<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  __l;
  allocator_type local_9a;
  ExprPtrLess local_99;
  pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_98;
  pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_78;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_50;
  
  baseAndExp(&local_78,
             (t->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_98.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_78.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_98.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_78.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  local_78.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_78.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (t->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_98.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (t->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_98.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_98.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_98.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_98.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_98.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = &local_98;
  std::
  map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  ::map((map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
         *)&local_50,__l,&local_99,&local_9a);
  mergeProduct<mathiu::impl::Product>(this,c,(Product *)&local_50);
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  ::~_Rb_tree(&local_50);
  _Var1._M_pi = extraout_RDX;
  if (local_98.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.second.
               super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_98.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.first.
               super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  if (local_78.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.second.
               super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX_02;
  }
  if (local_78.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.first.
               super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX_03;
  }
  sVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_mathiu::impl::Expr>)
         sVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto insertProduct(C const &c, T const &t)
    {
        return mergeProduct(c, C{{{baseAndExp(*t).first, t}}});
    }